

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_sync(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  if ((((ctx->opcode & 0x600000) == 0x400000) || ((ctx->insns_flags & 0x20) == 0)) &&
     (ctx->pr == false)) {
    gen_check_tlb_flush(ctx,true);
  }
  tcg_gen_mb_ppc64(tcg_ctx,TCG_BAR_SC|TCG_MO_ALL);
  return;
}

Assistant:

static void gen_sync(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    uint32_t l = (ctx->opcode >> 21) & 3;

    /*
     * We may need to check for a pending TLB flush.
     *
     * We do this on ptesync (l == 2) on ppc64 and any sync pn ppc32.
     *
     * Additionally, this can only happen in kernel mode however so
     * check MSR_PR as well.
     */
    if (((l == 2) || !(ctx->insns_flags & PPC_64B)) && !ctx->pr) {
        gen_check_tlb_flush(ctx, true);
    }
    tcg_gen_mb(tcg_ctx, TCG_MO_ALL | TCG_BAR_SC);
}